

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex.h
# Opt level: O2

void __thiscall
alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::NodeIterator::
NodeIterator(NodeIterator *this,self_type *index)

{
  stack<alex::AlexNode<int,_int>_*,_std::deque<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>_>
  *this_00;
  int iVar1;
  AlexNode<int,_int> *pAVar2;
  double dVar3;
  ulong uVar4;
  uint uVar5;
  model_node_type *node;
  
  this->index_ = index;
  this_00 = &this->node_stack_;
  this->cur_node_ = index->root_node_;
  std::
  stack<alex::AlexNode<int,int>*,std::deque<alex::AlexNode<int,int>*,std::allocator<alex::AlexNode<int,int>*>>>
  ::stack<std::deque<alex::AlexNode<int,int>*,std::allocator<alex::AlexNode<int,int>*>>,void>
            (this_00);
  pAVar2 = this->cur_node_;
  if ((pAVar2 != (AlexNode<int,_int> *)0x0) && (pAVar2->is_leaf_ == false)) {
    iVar1._0_1_ = pAVar2[1].is_leaf_;
    iVar1._1_1_ = pAVar2[1].duplication_factor_;
    iVar1._2_2_ = pAVar2[1].level_;
    std::deque<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>::push_back
              (&this_00->c,(value_type *)((long)pAVar2[1].model_.a_ + -8 + (long)iVar1 * 8));
    for (uVar5 = *(int *)&pAVar2[1].is_leaf_ - 2; -1 < (int)uVar5; uVar5 = uVar5 - 1) {
      dVar3 = pAVar2[1].model_.a_;
      uVar4 = (ulong)uVar5;
      if (*(long *)((long)dVar3 + uVar4 * 8) != *(long *)((long)dVar3 + 8 + uVar4 * 8)) {
        std::deque<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>::
        push_back(&this_00->c,(value_type *)((long)dVar3 + uVar4 * 8));
      }
    }
  }
  return;
}

Assistant:

explicit NodeIterator(const self_type* index)
        : index_(index), cur_node_(index->root_node_) {
      if (cur_node_ && !cur_node_->is_leaf_) {
        auto node = static_cast<model_node_type*>(cur_node_);
        node_stack_.push(node->children_[node->num_children_ - 1]);
        for (int i = node->num_children_ - 2; i >= 0; i--) {
          if (node->children_[i] != node->children_[i + 1]) {
            node_stack_.push(node->children_[i]);
          }
        }
      }
    }